

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::removeVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  AnchorVertex *second;
  AnchorVertex **ppAVar1;
  AnchorVertex *vertex;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar4;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.ptr = (AnchorVertex **)CONCAT44(local_58.d.ptr._4_4_,edge);
  local_58.d.d = (Data *)item;
  pVar4 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
          ::value(&this->m_vertexList,(pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&local_58);
  vertex = pVar4.first;
  if (vertex != (AnchorVertex *)0x0) {
    this_00 = (this->graph).m_data + (2 < (int)edge);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices(&local_58,this_00,vertex);
    ppAVar1 = local_58.d.ptr;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      lVar3 = local_58.d.size << 3;
      lVar2 = 0;
      do {
        second = *(AnchorVertex **)((long)ppAVar1 + lVar2);
        Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::removeEdge
                  (this_00,vertex,second);
        removeInternalVertex(this,item,edge);
        removeInternalVertex(this,second->m_item,second->m_edge);
        lVar2 = lVar2 + 8;
      } while (lVar3 != lVar2);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge)
{
    if (AnchorVertex *v = internalVertex(item, edge)) {
        Graph<AnchorVertex, AnchorData> &g = graph[edgeOrientation(edge)];
        const auto allVertices = g.adjacentVertices(v);
        for (auto *v2 : allVertices) {
            g.removeEdge(v, v2);
            removeInternalVertex(item, edge);
            removeInternalVertex(v2->m_item, v2->m_edge);
        }
    }
}